

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.h
# Opt level: O2

void __thiscall
btTriangleIndexVertexArray::addIndexedMesh
          (btTriangleIndexVertexArray *this,btIndexedMesh *mesh,PHY_ScalarType indexType)

{
  btAlignedObjectArray<btIndexedMesh>::push_back(&this->m_indexedMeshes,mesh);
  (this->m_indexedMeshes).m_data[(long)(this->m_indexedMeshes).m_size + -1].m_indexType = indexType;
  return;
}

Assistant:

void	addIndexedMesh(const btIndexedMesh& mesh, PHY_ScalarType indexType = PHY_INTEGER)
	{
		m_indexedMeshes.push_back(mesh);
		m_indexedMeshes[m_indexedMeshes.size()-1].m_indexType = indexType;
	}